

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O2

bool boost::operator==(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a,
                      dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b)

{
  unsigned_long *__first1;
  unsigned_long *puVar1;
  unsigned_long *__first2;
  int iVar2;
  ulong uVar3;
  
  if (a->m_num_bits != b->m_num_bits) {
    return false;
  }
  __first1 = (a->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  puVar1 = (a->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar1 - (long)__first1;
  __first2 = (b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar3 != (long)(b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
    return false;
  }
  if ((long)puVar1 - (long)__first1 != 0) {
    iVar2 = std::__memcmp<unsigned_long,unsigned_long>
                      (__first1,__first2,(long)puVar1 - (long)__first1 >> 3);
    uVar3 = (ulong)(iVar2 == 0);
  }
  return (bool)(puVar1 == __first1 | (byte)uVar3 & 1);
}

Assistant:

bool operator==(const dynamic_bitset<Block, Allocator>& a,
                const dynamic_bitset<Block, Allocator>& b)
{
    return (a.m_num_bits == b.m_num_bits)
           && (a.m_bits == b.m_bits);
}